

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **args)

{
  vector<ErrorInfoException,_std::allocator<ErrorInfoException>_> *pvVar1;
  vector<Token,_std::allocator<Token>_> *v;
  set<Symbol,_std::less<Symbol>,_std::allocator<Symbol>_> *v_00;
  char *pcVar2;
  pair<std::vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_>,_std::vector<ErrorInfoException,_std::allocator<ErrorInfoException>_>_>
  lines;
  string filename;
  lexical lexical;
  Table table;
  vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_> local_260;
  pair<std::vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_>,_std::vector<ErrorInfoException,_std::allocator<ErrorInfoException>_>_>
  local_248;
  undefined1 *local_218 [2];
  undefined1 local_208 [16];
  undefined1 local_1f8 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_198;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_168;
  vector<Token,_std::allocator<Token>_> local_138;
  vector<ErrorInfoException,_std::allocator<ErrorInfoException>_> local_120;
  _Rb_tree<Symbol,_Symbol,_std::_Identity<Symbol>,_std::less<Symbol>,_std::allocator<Symbol>_>
  local_108;
  Table local_d8;
  
  if (argc < 2) {
    pcVar2 = "code.java";
  }
  else {
    pcVar2 = args[1];
  }
  std::__cxx11::string::string((string *)local_218,pcVar2,(allocator *)local_1f8);
  readCode((string *)local_1f8);
  StringLine::convert_string(&local_248,(string *)local_1f8._0_8_);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_);
  }
  local_d8.keyWords._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_d8.keyWords._M_t._M_impl.super__Rb_tree_header._M_header;
  local_d8.keyWords._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_d8.keyWords._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_d8.keyWords._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d8.operators._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_d8.operators._M_t._M_impl.super__Rb_tree_header._M_header;
  local_d8.operators._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_d8.operators._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_d8.operators._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d8.delimiters._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_d8.delimiters._M_t._M_impl.super__Rb_tree_header._M_header;
  local_d8.delimiters._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_d8.delimiters._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_d8.delimiters._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d8.escape_chars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_d8.escape_chars._M_t._M_impl.super__Rb_tree_header._M_header;
  local_d8.escape_chars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_d8.escape_chars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_d8.escape_chars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d8.keyWords._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_d8.keyWords._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_d8.operators._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_d8.operators._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_d8.delimiters._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_d8.delimiters._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_d8.escape_chars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_d8.escape_chars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Table::load_all(&local_d8);
  ::lexical::lexical((lexical *)local_1f8,&local_d8);
  std::vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_>::vector
            (&local_260,&local_248.first);
  ::lexical::analyse((lexical *)local_1f8,&local_260);
  std::vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_>::~vector
            (&local_260);
  pvVar1 = ::lexical::get_errors((lexical *)local_1f8);
  print_code(&local_248.first,pvVar1);
  pvVar1 = ::lexical::get_errors((lexical *)local_1f8);
  print_errors(pvVar1);
  v = ::lexical::get_tokens((lexical *)local_1f8);
  print_token(v);
  v_00 = ::lexical::get_symbols((lexical *)local_1f8);
  print_symbols(v_00);
  std::_Rb_tree<Symbol,_Symbol,_std::_Identity<Symbol>,_std::less<Symbol>,_std::allocator<Symbol>_>
  ::~_Rb_tree(&local_108);
  std::vector<ErrorInfoException,_std::allocator<ErrorInfoException>_>::~vector(&local_120);
  std::vector<Token,_std::allocator<Token>_>::~vector(&local_138);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_168);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_198);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_1c8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1f8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_d8.escape_chars._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_d8.delimiters._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_d8.operators._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_d8);
  std::vector<ErrorInfoException,_std::allocator<ErrorInfoException>_>::~vector(&local_248.second);
  std::vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_>::~vector
            (&local_248.first);
  if (local_218[0] != local_208) {
    operator_delete(local_218[0]);
  }
  return 0;
}

Assistant:

int main(int argc, char **args) {
    string filename = argc < 2 ? "code.java" : args[1];

    /**
     * 去除注释
     */
    auto lines = StringLine::convert_string(readCode(filename).get());
    /**
     * 加载 关键字、运算符、分隔符表
     */
    Table table;
    table.load_all();
    /**
     * 调用词法分析器
     */
    lexical lexical(table);
    lexical.analyse(lines.first);


    print_code(lines.first, lexical.get_errors());
    print_errors(lexical.get_errors());
    print_token(lexical.get_tokens());
    print_symbols(lexical.get_symbols());
}